

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O3

void destroyContextOSMesa(_GLFWwindow *window)

{
  OSMesaContext pvVar1;
  void *block;
  
  pvVar1 = (window->context).osmesa.handle;
  if (pvVar1 != (OSMesaContext)0x0) {
    (*_glfw.osmesa.DestroyContext)(pvVar1);
    (window->context).osmesa.handle = (OSMesaContext)0x0;
  }
  block = (window->context).osmesa.buffer;
  if (block != (void *)0x0) {
    _glfw_free(block);
    (window->context).osmesa.width = 0;
    (window->context).osmesa.height = 0;
  }
  return;
}

Assistant:

static void destroyContextOSMesa(_GLFWwindow* window)
{
    if (window->context.osmesa.handle)
    {
        OSMesaDestroyContext(window->context.osmesa.handle);
        window->context.osmesa.handle = NULL;
    }

    if (window->context.osmesa.buffer)
    {
        _glfw_free(window->context.osmesa.buffer);
        window->context.osmesa.width = 0;
        window->context.osmesa.height = 0;
    }
}